

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall AGSSock::AGSSocket::Dispose(AGSSocket *this,char *ptr,bool force)

{
  Socket *sock;
  bool force_local;
  char *ptr_local;
  AGSSocket *this_local;
  
  if (*(int *)ptr != -1) {
    Pool::remove(pool,ptr);
    close(*(int *)ptr);
    ptr[0] = -1;
    ptr[1] = -1;
    ptr[2] = -1;
    ptr[3] = -1;
  }
  if (*(long *)(ptr + 0x18) != 0) {
    (**(code **)(*AGSSockAPI::engine + 600))(AGSSockAPI::engine,*(undefined8 *)(ptr + 0x18));
    ptr[0x18] = '\0';
    ptr[0x19] = '\0';
    ptr[0x1a] = '\0';
    ptr[0x1b] = '\0';
    ptr[0x1c] = '\0';
    ptr[0x1d] = '\0';
    ptr[0x1e] = '\0';
    ptr[0x1f] = '\0';
  }
  if (*(long *)(ptr + 0x20) != 0) {
    (**(code **)(*AGSSockAPI::engine + 600))(AGSSockAPI::engine,*(undefined8 *)(ptr + 0x20));
    ptr[0x20] = '\0';
    ptr[0x21] = '\0';
    ptr[0x22] = '\0';
    ptr[0x23] = '\0';
    ptr[0x24] = '\0';
    ptr[0x25] = '\0';
    ptr[0x26] = '\0';
    ptr[0x27] = '\0';
  }
  if (ptr != (char *)0x0) {
    Socket::~Socket((Socket *)ptr);
    operator_delete(ptr,0xa0);
  }
  return 1;
}

Assistant:

int AGSSocket::Dispose(const char *ptr, bool force)
{
	Socket *sock = (Socket *) ptr;
	
	if (sock->id != SOCKET_ERROR)
	{
		// Invalidate socket, forced close.
		pool->remove(sock);
		closesocket(sock->id);
		sock->id = SOCKET_ERROR;
	}
	
	if (sock->local != nullptr)
	{
		AGS_RELEASE(sock->local);
		sock->local = nullptr;
	}
	
	if (sock->remote != nullptr)
	{
		AGS_RELEASE(sock->remote);
		sock->remote = nullptr;
	}

	delete sock;
	return 1;
}